

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O3

void QWindowContainer::parentWasChanged(QWidget *parent)

{
  QWindowContainerPrivate *this;
  QWidgetPrivate *this_00;
  Data *pDVar1;
  long lVar2;
  QWidget *this_01;
  QWindow *pQVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  
  lVar2 = QMetaObject::cast((QObject *)&staticMetaObject);
  if ((lVar2 != 0) &&
     (this = *(QWindowContainerPrivate **)(lVar2 + 8), this != (QWindowContainerPrivate *)0x0)) {
    lVar2 = QWindow::parent((this->window).wp.value,0);
    if (lVar2 != 0) {
      QWindowContainerPrivate::updateUsesNativeWidgets(this);
      QWindowContainerPrivate::markParentChain(this);
      this_01 = parent;
      if ((this->field_0x290 & 1) == 0) {
        this_01 = QWidget::window(parent);
      }
      pQVar3 = QWidget::windowHandle(this_01);
      if (pQVar3 == (QWindow *)0x0) {
        this_00 = *(QWidgetPrivate **)&this_01->field_0x8;
        QWidgetPrivate::createTLExtra(this_00);
        QWidgetPrivate::createTLSysExtra(this_00);
      }
      pQVar5 = (QObject *)0x0;
      pQVar4 = (QObject *)QWindow::parent((this->window).wp.value,0);
      QObject::removeEventFilter(pQVar4);
      pDVar1 = (this->window).wp.d;
      if (pDVar1 != (Data *)0x0) {
        if (*(int *)(pDVar1 + 4) == 0) {
          pQVar5 = (QObject *)0x0;
        }
        else {
          pQVar5 = (this->window).wp.value;
        }
      }
      QWidget::windowHandle(this_01);
      QWindow::setParent((QWindow *)pQVar5);
      pQVar3 = QWidget::windowHandle(this_01);
      QObject::installEventFilter((QObject *)pQVar3);
      QWindow::destroy();
      QWindowContainerPrivate::updateGeometry(this);
    }
  }
  qwindowcontainer_traverse(*(QWidget **)&parent->field_0x8,parentWasChanged);
  return;
}

Assistant:

void QWindowContainer::parentWasChanged(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (d->window->parent()) {
            d->updateUsesNativeWidgets();
            d->markParentChain();
            QWidget *toplevel = d->usesNativeWidgets ? parent : parent->window();
            if (!toplevel->windowHandle()) {
                QWidgetPrivate *tld = static_cast<QWidgetPrivate *>(QWidgetPrivate::get(toplevel));
                tld->createTLExtra();
                tld->createTLSysExtra();
                Q_ASSERT(toplevel->windowHandle());
            }
            d->window->parent()->removeEventFilter(parent);
            d->window->setParent(toplevel->windowHandle());
            toplevel->windowHandle()->installEventFilter(parent);
            d->fakeParent.destroy();
            d->updateGeometry();
        }
    }
    qwindowcontainer_traverse(parent, parentWasChanged);
}